

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O2

void ga_inquire_(Integer *g_a,Integer *type,Integer *dim1,Integer *dim2)

{
  Integer IVar1;
  Integer dims [2];
  Integer ndim;
  Integer local_38;
  Integer local_30;
  long local_28;
  
  pnga_inquire(*g_a,type,&local_28,&local_38);
  if (local_28 != 2) {
    pnga_error("Wrong array dimension in ga_inquire",local_28);
  }
  IVar1 = pnga_type_c2f(*type);
  *type = IVar1;
  *dim1 = local_38;
  *dim2 = local_30;
  return;
}

Assistant:

void FATR ga_inquire_(Integer *g_a, Integer *type, Integer *dim1, Integer *dim2)
{
  Integer dims[2], ndim;
  wnga_inquire(*g_a, type, &ndim, dims);
  if (ndim != 2) wnga_error("Wrong array dimension in ga_inquire",ndim);
  *type = pnga_type_c2f(*type);
  *dim1 = dims[0];
  *dim2 = dims[1];
}